

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FboInvalidateTests::init(FboInvalidateTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *pTVar2;
  InvalidateDefaultFramebufferRenderCase *pIVar3;
  InvalidateDefaultFramebufferBindCase *pIVar4;
  InvalidateDefaultSubFramebufferRenderCase *pIVar5;
  InvalidateDefaultSubFramebufferBindCase *pIVar6;
  InvalidateFboRenderCase *pIVar7;
  InvalidateFboUnbindReadCase *pIVar8;
  InvalidateFboUnbindBlitCase *pIVar9;
  InvalidateSubFboRenderCase *pIVar10;
  InvalidateSubFboUnbindReadCase *pIVar11;
  InvalidateSubFboUnbindBlitCase *pIVar12;
  char *pcVar13;
  ulong extraout_RAX;
  InvalidateFboTargetCase *pIVar14;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  deUint32 local_84;
  deUint32 local_80;
  deUint32 boundT;
  deUint32 invalidateT;
  string baseName;
  int caseNdx;
  TestCaseGroup *targetGroup;
  int ndx_1;
  int ndx;
  TestCaseGroup *formatGroup;
  TestCaseGroup *subFboGroup;
  TestCaseGroup *wholeFboGroup;
  TestCaseGroup *defaultFbGroup;
  FboInvalidateTests *this_local;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"default",
             "Default framebuffer invalidate tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"render_none",
             "Invalidating no framebuffers (ref)",0,0x8d40);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"render_color",
             "Rendering after invalidating colorbuffer",0x4000,0x8d40);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"render_depth",
             "Rendering after invalidating depthbuffer",0x100,0x8d40);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"render_stencil",
             "Rendering after invalidating stencilbuffer",0x400,0x8d40);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"render_depth_stencil",
             "Rendering after invalidating depth- and stencilbuffers",0x500,0x8d40);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"render_all",
             "Rendering after invalidating all buffers",0x4500,0x8d40);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar4 = (InvalidateDefaultFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultFramebufferBindCase::InvalidateDefaultFramebufferBindCase
            (pIVar4,(this->super_TestCaseGroup).m_context,"bind_color",
             "Binding fbo after invalidating colorbuffer",0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
  pIVar4 = (InvalidateDefaultFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultFramebufferBindCase::InvalidateDefaultFramebufferBindCase
            (pIVar4,(this->super_TestCaseGroup).m_context,"bind_depth",
             "Binding fbo after invalidating depthbuffer",0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
  pIVar4 = (InvalidateDefaultFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultFramebufferBindCase::InvalidateDefaultFramebufferBindCase
            (pIVar4,(this->super_TestCaseGroup).m_context,"bind_stencil",
             "Binding fbo after invalidating stencilbuffer",0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
  pIVar4 = (InvalidateDefaultFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultFramebufferBindCase::InvalidateDefaultFramebufferBindCase
            (pIVar4,(this->super_TestCaseGroup).m_context,"bind_depth_stencil",
             "Binding fbo after invalidating depth- and stencilbuffers",0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
  pIVar4 = (InvalidateDefaultFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultFramebufferBindCase::InvalidateDefaultFramebufferBindCase
            (pIVar4,(this->super_TestCaseGroup).m_context,"bind_all",
             "Binding fbo after invalidating all buffers",0x4500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
  pIVar5 = (InvalidateDefaultSubFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferRenderCase::InvalidateDefaultSubFramebufferRenderCase
            (pIVar5,(this->super_TestCaseGroup).m_context,"sub_render_color",
             "Rendering after invalidating colorbuffer",0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  pIVar5 = (InvalidateDefaultSubFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferRenderCase::InvalidateDefaultSubFramebufferRenderCase
            (pIVar5,(this->super_TestCaseGroup).m_context,"sub_render_depth",
             "Rendering after invalidating depthbuffer",0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  pIVar5 = (InvalidateDefaultSubFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferRenderCase::InvalidateDefaultSubFramebufferRenderCase
            (pIVar5,(this->super_TestCaseGroup).m_context,"sub_render_stencil",
             "Rendering after invalidating stencilbuffer",0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  pIVar5 = (InvalidateDefaultSubFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferRenderCase::InvalidateDefaultSubFramebufferRenderCase
            (pIVar5,(this->super_TestCaseGroup).m_context,"sub_render_depth_stencil",
             "Rendering after invalidating depth- and stencilbuffers",0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  pIVar5 = (InvalidateDefaultSubFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferRenderCase::InvalidateDefaultSubFramebufferRenderCase
            (pIVar5,(this->super_TestCaseGroup).m_context,"sub_render_all",
             "Rendering after invalidating all buffers",0x4500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  pIVar6 = (InvalidateDefaultSubFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferBindCase::InvalidateDefaultSubFramebufferBindCase
            (pIVar6,(this->super_TestCaseGroup).m_context,"sub_bind_color",
             "Binding fbo after invalidating colorbuffer",0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar6 = (InvalidateDefaultSubFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferBindCase::InvalidateDefaultSubFramebufferBindCase
            (pIVar6,(this->super_TestCaseGroup).m_context,"sub_bind_depth",
             "Binding fbo after invalidating depthbuffer",0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar6 = (InvalidateDefaultSubFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferBindCase::InvalidateDefaultSubFramebufferBindCase
            (pIVar6,(this->super_TestCaseGroup).m_context,"sub_bind_stencil",
             "Binding fbo after invalidating stencilbuffer",0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar6 = (InvalidateDefaultSubFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferBindCase::InvalidateDefaultSubFramebufferBindCase
            (pIVar6,(this->super_TestCaseGroup).m_context,"sub_bind_depth_stencil",
             "Binding fbo after invalidating depth- and stencilbuffers",0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar6 = (InvalidateDefaultSubFramebufferBindCase *)operator_new(0x90);
  InvalidateDefaultSubFramebufferBindCase::InvalidateDefaultSubFramebufferBindCase
            (pIVar6,(this->super_TestCaseGroup).m_context,"sub_bind_all",
             "Binding fbo after invalidating all buffers",0x4500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"draw_framebuffer_color",
             "Invalidating GL_COLOR in GL_DRAW_FRAMEBUFFER",0x4000,0x8ca9);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"draw_framebuffer_all",
             "Invalidating all in GL_DRAW_FRAMEBUFFER",0x4500,0x8ca9);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"read_framebuffer_color",
             "Invalidating GL_COLOR in GL_READ_FRAMEBUFFER",0x4000,0x8ca8);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (InvalidateDefaultFramebufferRenderCase *)operator_new(0x90);
  InvalidateDefaultFramebufferRenderCase::InvalidateDefaultFramebufferRenderCase
            (pIVar3,(this->super_TestCaseGroup).m_context,"read_framebuffer_all",
             "Invalidating all in GL_READ_FRAMEBUFFER",0x4500,0x8ca8);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"whole",
             "Invalidating whole framebuffer object");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pIVar7 = (InvalidateFboRenderCase *)operator_new(0x98);
  InvalidateFboRenderCase::InvalidateFboRenderCase
            (pIVar7,(this->super_TestCaseGroup).m_context,"render_none","",0x8058,0x88f0,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar7);
  pIVar7 = (InvalidateFboRenderCase *)operator_new(0x98);
  InvalidateFboRenderCase::InvalidateFboRenderCase
            (pIVar7,(this->super_TestCaseGroup).m_context,"render_color","",0x8058,0x88f0,0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar7);
  pIVar7 = (InvalidateFboRenderCase *)operator_new(0x98);
  InvalidateFboRenderCase::InvalidateFboRenderCase
            (pIVar7,(this->super_TestCaseGroup).m_context,"render_depth","",0x8058,0x88f0,0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar7);
  pIVar7 = (InvalidateFboRenderCase *)operator_new(0x98);
  InvalidateFboRenderCase::InvalidateFboRenderCase
            (pIVar7,(this->super_TestCaseGroup).m_context,"render_stencil","",0x8058,0x88f0,0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar7);
  pIVar7 = (InvalidateFboRenderCase *)operator_new(0x98);
  InvalidateFboRenderCase::InvalidateFboRenderCase
            (pIVar7,(this->super_TestCaseGroup).m_context,"render_depth_stencil","",0x8058,0x88f0,
             0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar7);
  pIVar7 = (InvalidateFboRenderCase *)operator_new(0x98);
  InvalidateFboRenderCase::InvalidateFboRenderCase
            (pIVar7,(this->super_TestCaseGroup).m_context,"render_all","",0x8058,0x88f0,0x4500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar7);
  pIVar8 = (InvalidateFboUnbindReadCase *)operator_new(0x98);
  InvalidateFboUnbindReadCase::InvalidateFboUnbindReadCase
            (pIVar8,(this->super_TestCaseGroup).m_context,"unbind_read_color","",0x8058,0x88f0,
             0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar8);
  pIVar8 = (InvalidateFboUnbindReadCase *)operator_new(0x98);
  InvalidateFboUnbindReadCase::InvalidateFboUnbindReadCase
            (pIVar8,(this->super_TestCaseGroup).m_context,"unbind_read_depth","",0x8058,0x88f0,0x100
            );
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar8);
  pIVar8 = (InvalidateFboUnbindReadCase *)operator_new(0x98);
  InvalidateFboUnbindReadCase::InvalidateFboUnbindReadCase
            (pIVar8,(this->super_TestCaseGroup).m_context,"unbind_read_stencil","",0x8058,0x88f0,
             0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar8);
  pIVar8 = (InvalidateFboUnbindReadCase *)operator_new(0x98);
  InvalidateFboUnbindReadCase::InvalidateFboUnbindReadCase
            (pIVar8,(this->super_TestCaseGroup).m_context,"unbind_read_depth_stencil","",0x8058,
             0x88f0,0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar8);
  pIVar8 = (InvalidateFboUnbindReadCase *)operator_new(0x98);
  InvalidateFboUnbindReadCase::InvalidateFboUnbindReadCase
            (pIVar8,(this->super_TestCaseGroup).m_context,"unbind_read_color_stencil","",0x8058,
             0x88f0,0x4400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar8);
  pIVar9 = (InvalidateFboUnbindBlitCase *)operator_new(0x98);
  InvalidateFboUnbindBlitCase::InvalidateFboUnbindBlitCase
            (pIVar9,(this->super_TestCaseGroup).m_context,"unbind_blit_color","",0,0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar9);
  pIVar9 = (InvalidateFboUnbindBlitCase *)operator_new(0x98);
  InvalidateFboUnbindBlitCase::InvalidateFboUnbindBlitCase
            (pIVar9,(this->super_TestCaseGroup).m_context,"unbind_blit_depth","",0,0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar9);
  pIVar9 = (InvalidateFboUnbindBlitCase *)operator_new(0x98);
  InvalidateFboUnbindBlitCase::InvalidateFboUnbindBlitCase
            (pIVar9,(this->super_TestCaseGroup).m_context,"unbind_blit_stencil","",0,0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar9);
  pIVar9 = (InvalidateFboUnbindBlitCase *)operator_new(0x98);
  InvalidateFboUnbindBlitCase::InvalidateFboUnbindBlitCase
            (pIVar9,(this->super_TestCaseGroup).m_context,"unbind_blit_depth_stencil","",0,0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar9);
  pIVar9 = (InvalidateFboUnbindBlitCase *)operator_new(0x98);
  InvalidateFboUnbindBlitCase::InvalidateFboUnbindBlitCase
            (pIVar9,(this->super_TestCaseGroup).m_context,"unbind_blit_msaa_color","",4,0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar9);
  pIVar9 = (InvalidateFboUnbindBlitCase *)operator_new(0x98);
  InvalidateFboUnbindBlitCase::InvalidateFboUnbindBlitCase
            (pIVar9,(this->super_TestCaseGroup).m_context,"unbind_blit_msaa_depth","",4,0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar9);
  pIVar9 = (InvalidateFboUnbindBlitCase *)operator_new(0x98);
  InvalidateFboUnbindBlitCase::InvalidateFboUnbindBlitCase
            (pIVar9,(this->super_TestCaseGroup).m_context,"unbind_blit_msaa_stencil","",4,0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar9);
  pIVar9 = (InvalidateFboUnbindBlitCase *)operator_new(0x98);
  InvalidateFboUnbindBlitCase::InvalidateFboUnbindBlitCase
            (pIVar9,(this->super_TestCaseGroup).m_context,"unbind_blit_msaa_depth_stencil","",4,
             0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar9);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sub",
             "Invalidating subsection of framebuffer object");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pIVar10 = (InvalidateSubFboRenderCase *)operator_new(0x98);
  InvalidateSubFboRenderCase::InvalidateSubFboRenderCase
            (pIVar10,(this->super_TestCaseGroup).m_context,"render_none","",0x8058,0x88f0,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar10);
  pIVar10 = (InvalidateSubFboRenderCase *)operator_new(0x98);
  InvalidateSubFboRenderCase::InvalidateSubFboRenderCase
            (pIVar10,(this->super_TestCaseGroup).m_context,"render_color","",0x8058,0x88f0,0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar10);
  pIVar10 = (InvalidateSubFboRenderCase *)operator_new(0x98);
  InvalidateSubFboRenderCase::InvalidateSubFboRenderCase
            (pIVar10,(this->super_TestCaseGroup).m_context,"render_depth","",0x8058,0x88f0,0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar10);
  pIVar10 = (InvalidateSubFboRenderCase *)operator_new(0x98);
  InvalidateSubFboRenderCase::InvalidateSubFboRenderCase
            (pIVar10,(this->super_TestCaseGroup).m_context,"render_stencil","",0x8058,0x88f0,0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar10);
  pIVar10 = (InvalidateSubFboRenderCase *)operator_new(0x98);
  InvalidateSubFboRenderCase::InvalidateSubFboRenderCase
            (pIVar10,(this->super_TestCaseGroup).m_context,"render_depth_stencil","",0x8058,0x88f0,
             0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar10);
  pIVar10 = (InvalidateSubFboRenderCase *)operator_new(0x98);
  InvalidateSubFboRenderCase::InvalidateSubFboRenderCase
            (pIVar10,(this->super_TestCaseGroup).m_context,"render_all","",0x8058,0x88f0,0x4500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar10);
  pIVar11 = (InvalidateSubFboUnbindReadCase *)operator_new(0x98);
  InvalidateSubFboUnbindReadCase::InvalidateSubFboUnbindReadCase
            (pIVar11,(this->super_TestCaseGroup).m_context,"unbind_read_color","",0x8058,0x88f0,
             0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar11);
  pIVar11 = (InvalidateSubFboUnbindReadCase *)operator_new(0x98);
  InvalidateSubFboUnbindReadCase::InvalidateSubFboUnbindReadCase
            (pIVar11,(this->super_TestCaseGroup).m_context,"unbind_read_depth","",0x8058,0x88f0,
             0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar11);
  pIVar11 = (InvalidateSubFboUnbindReadCase *)operator_new(0x98);
  InvalidateSubFboUnbindReadCase::InvalidateSubFboUnbindReadCase
            (pIVar11,(this->super_TestCaseGroup).m_context,"unbind_read_stencil","",0x8058,0x88f0,
             0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar11);
  pIVar11 = (InvalidateSubFboUnbindReadCase *)operator_new(0x98);
  InvalidateSubFboUnbindReadCase::InvalidateSubFboUnbindReadCase
            (pIVar11,(this->super_TestCaseGroup).m_context,"unbind_read_depth_stencil","",0x8058,
             0x88f0,0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar11);
  pIVar11 = (InvalidateSubFboUnbindReadCase *)operator_new(0x98);
  InvalidateSubFboUnbindReadCase::InvalidateSubFboUnbindReadCase
            (pIVar11,(this->super_TestCaseGroup).m_context,"unbind_read_color_stencil","",0x8058,
             0x88f0,0x4400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar11);
  pIVar12 = (InvalidateSubFboUnbindBlitCase *)operator_new(0x98);
  InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"unbind_blit_color","",0,0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar12);
  pIVar12 = (InvalidateSubFboUnbindBlitCase *)operator_new(0x98);
  InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"unbind_blit_depth","",0,0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar12);
  pIVar12 = (InvalidateSubFboUnbindBlitCase *)operator_new(0x98);
  InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"unbind_blit_stencil","",0,0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar12);
  pIVar12 = (InvalidateSubFboUnbindBlitCase *)operator_new(0x98);
  InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"unbind_blit_depth_stencil","",0,0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar12);
  pIVar12 = (InvalidateSubFboUnbindBlitCase *)operator_new(0x98);
  InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"unbind_blit_msaa_color","",4,0x4000);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar12);
  pIVar12 = (InvalidateSubFboUnbindBlitCase *)operator_new(0x98);
  InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"unbind_blit_msaa_depth","",4,0x100);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar12);
  pIVar12 = (InvalidateSubFboUnbindBlitCase *)operator_new(0x98);
  InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"unbind_blit_msaa_stencil","",4,0x400);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar12);
  pIVar12 = (InvalidateSubFboUnbindBlitCase *)operator_new(0x98);
  InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"unbind_blit_msaa_depth_stencil","",4,
             0x500);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar12);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"format",
             "Invalidating framebuffers with selected formats");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (targetGroup._4_4_ = 0; targetGroup._4_4_ < 0x23; targetGroup._4_4_ = targetGroup._4_4_ + 1) {
    pIVar11 = (InvalidateSubFboUnbindReadCase *)operator_new(0x98);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar13 = FboTestUtil::getFormatName(init::colorFormats[targetGroup._4_4_]);
    InvalidateSubFboUnbindReadCase::InvalidateSubFboUnbindReadCase
              (pIVar11,pCVar1,pcVar13,"",init::colorFormats[targetGroup._4_4_],0,0x4000);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar11);
  }
  for (targetGroup._0_4_ = 0; (int)targetGroup < 6; targetGroup._0_4_ = (int)targetGroup + 1) {
    pIVar10 = (InvalidateSubFboRenderCase *)operator_new(0x98);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar13 = FboTestUtil::getFormatName(init::depthStencilFormats[(int)targetGroup]);
    InvalidateSubFboRenderCase::InvalidateSubFboRenderCase
              (pIVar10,pCVar1,pcVar13,"",0x8058,init::depthStencilFormats[(int)targetGroup],0x500);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar10);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"target",
             "Invalidate target");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  baseName.field_2._12_4_ = 0;
  uVar15 = extraout_RAX;
  while ((int)baseName.field_2._12_4_ < 9) {
    pcVar13 = init::s_targetCases[(int)baseName.field_2._12_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&invalidateT,pcVar13,(allocator<char> *)((long)&boundT + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&boundT + 3));
    local_80 = init::s_targetCases[(int)baseName.field_2._12_4_].invalidateTarget;
    local_84 = init::s_targetCases[(int)baseName.field_2._12_4_].boundTarget;
    pIVar14 = (InvalidateFboTargetCase *)operator_new(0xa8);
    local_a9 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&invalidateT
                   ,"_color");
    pcVar13 = (char *)std::__cxx11::string::c_str();
    InvalidateFboTargetCase::InvalidateFboTargetCase
              (pIVar14,pCVar1,pcVar13,"",local_84,local_80,init::colorAttachment,1);
    local_a9 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar14);
    std::__cxx11::string::~string((string *)&local_a8);
    pIVar14 = (InvalidateFboTargetCase *)operator_new(0xa8);
    local_d1 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&invalidateT
                   ,"_depth_stencil");
    pcVar13 = (char *)std::__cxx11::string::c_str();
    InvalidateFboTargetCase::InvalidateFboTargetCase
              (pIVar14,pCVar1,pcVar13,"",local_84,local_80,init::depthStencilAttachment,1);
    local_d1 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar14);
    std::__cxx11::string::~string((string *)&local_d0);
    pIVar14 = (InvalidateFboTargetCase *)operator_new(0xa8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&invalidateT
                   ,"_all");
    pcVar13 = (char *)std::__cxx11::string::c_str();
    InvalidateFboTargetCase::InvalidateFboTargetCase
              (pIVar14,pCVar1,pcVar13,"",local_84,local_80,init::allAttachments,3);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar14);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&invalidateT);
    baseName.field_2._12_4_ = baseName.field_2._12_4_ + 1;
    uVar15 = (ulong)(uint)baseName.field_2._12_4_;
  }
  return (int)uVar15;
}

Assistant:

void FboInvalidateTests::init (void)
{
	// invalidate.default.
	{
		tcu::TestCaseGroup* defaultFbGroup = new tcu::TestCaseGroup(m_testCtx, "default", "Default framebuffer invalidate tests");
		addChild(defaultFbGroup);

		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"render_none",				"Invalidating no framebuffers (ref)",						0));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"render_color",				"Rendering after invalidating colorbuffer",					GL_COLOR_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"render_depth",				"Rendering after invalidating depthbuffer",					GL_DEPTH_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"render_stencil",			"Rendering after invalidating stencilbuffer",				GL_STENCIL_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"render_depth_stencil",		"Rendering after invalidating depth- and stencilbuffers",	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"render_all",				"Rendering after invalidating all buffers",					GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		defaultFbGroup->addChild(new InvalidateDefaultFramebufferBindCase		(m_context,	"bind_color",				"Binding fbo after invalidating colorbuffer",				GL_COLOR_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferBindCase		(m_context,	"bind_depth",				"Binding fbo after invalidating depthbuffer",				GL_DEPTH_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferBindCase		(m_context,	"bind_stencil",				"Binding fbo after invalidating stencilbuffer",				GL_STENCIL_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferBindCase		(m_context,	"bind_depth_stencil",		"Binding fbo after invalidating depth- and stencilbuffers",	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferBindCase		(m_context,	"bind_all",					"Binding fbo after invalidating all buffers",				GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferRenderCase	(m_context,	"sub_render_color",			"Rendering after invalidating colorbuffer",					GL_COLOR_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferRenderCase	(m_context,	"sub_render_depth",			"Rendering after invalidating depthbuffer",					GL_DEPTH_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferRenderCase	(m_context,	"sub_render_stencil",		"Rendering after invalidating stencilbuffer",				GL_STENCIL_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferRenderCase	(m_context,	"sub_render_depth_stencil",	"Rendering after invalidating depth- and stencilbuffers",	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferRenderCase	(m_context,	"sub_render_all",			"Rendering after invalidating all buffers",					GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferBindCase	(m_context,	"sub_bind_color",			"Binding fbo after invalidating colorbuffer",				GL_COLOR_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferBindCase	(m_context,	"sub_bind_depth",			"Binding fbo after invalidating depthbuffer",				GL_DEPTH_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferBindCase	(m_context,	"sub_bind_stencil",			"Binding fbo after invalidating stencilbuffer",				GL_STENCIL_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferBindCase	(m_context,	"sub_bind_depth_stencil",	"Binding fbo after invalidating depth- and stencilbuffers",	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
		defaultFbGroup->addChild(new InvalidateDefaultSubFramebufferBindCase	(m_context,	"sub_bind_all",				"Binding fbo after invalidating all buffers",				GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"draw_framebuffer_color",	"Invalidating GL_COLOR in GL_DRAW_FRAMEBUFFER",				GL_COLOR_BUFFER_BIT,											GL_DRAW_FRAMEBUFFER));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"draw_framebuffer_all",		"Invalidating all in GL_DRAW_FRAMEBUFFER",					GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT,	GL_DRAW_FRAMEBUFFER));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"read_framebuffer_color",	"Invalidating GL_COLOR in GL_READ_FRAMEBUFFER",				GL_COLOR_BUFFER_BIT,											GL_READ_FRAMEBUFFER));
		defaultFbGroup->addChild(new InvalidateDefaultFramebufferRenderCase		(m_context,	"read_framebuffer_all",		"Invalidating all in GL_READ_FRAMEBUFFER",					GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT,	GL_READ_FRAMEBUFFER));
	}

	// invalidate.whole.
	{
		tcu::TestCaseGroup* wholeFboGroup = new tcu::TestCaseGroup(m_testCtx, "whole", "Invalidating whole framebuffer object");
		addChild(wholeFboGroup);

		wholeFboGroup->addChild(new InvalidateFboRenderCase		(m_context, "render_none",						"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	0));
		wholeFboGroup->addChild(new InvalidateFboRenderCase		(m_context, "render_color",						"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_COLOR_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboRenderCase		(m_context, "render_depth",						"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_DEPTH_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboRenderCase		(m_context, "render_stencil",					"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_STENCIL_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboRenderCase		(m_context, "render_depth_stencil",				"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboRenderCase		(m_context, "render_all",						"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		wholeFboGroup->addChild(new InvalidateFboUnbindReadCase	(m_context, "unbind_read_color",				"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_COLOR_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindReadCase	(m_context, "unbind_read_depth",				"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_DEPTH_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindReadCase	(m_context, "unbind_read_stencil",				"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_STENCIL_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindReadCase	(m_context, "unbind_read_depth_stencil",		"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindReadCase	(m_context, "unbind_read_color_stencil",		"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		wholeFboGroup->addChild(new InvalidateFboUnbindBlitCase	(m_context, "unbind_blit_color",				"",		0,	GL_COLOR_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindBlitCase	(m_context, "unbind_blit_depth",				"",		0,	GL_DEPTH_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindBlitCase	(m_context, "unbind_blit_stencil",				"",		0,	GL_STENCIL_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindBlitCase	(m_context, "unbind_blit_depth_stencil",		"",		0,	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		wholeFboGroup->addChild(new InvalidateFboUnbindBlitCase	(m_context, "unbind_blit_msaa_color",			"",		4,	GL_COLOR_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindBlitCase	(m_context, "unbind_blit_msaa_depth",			"",		4,	GL_DEPTH_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindBlitCase	(m_context, "unbind_blit_msaa_stencil",			"",		4,	GL_STENCIL_BUFFER_BIT));
		wholeFboGroup->addChild(new InvalidateFboUnbindBlitCase	(m_context, "unbind_blit_msaa_depth_stencil",	"",		4,	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
	}

	// invalidate.sub.
	{
		tcu::TestCaseGroup* subFboGroup = new tcu::TestCaseGroup(m_testCtx, "sub", "Invalidating subsection of framebuffer object");
		addChild(subFboGroup);

		subFboGroup->addChild(new InvalidateSubFboRenderCase	(m_context, "render_none",						"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	0));
		subFboGroup->addChild(new InvalidateSubFboRenderCase	(m_context, "render_color",						"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_COLOR_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboRenderCase	(m_context, "render_depth",						"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_DEPTH_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboRenderCase	(m_context, "render_stencil",					"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_STENCIL_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboRenderCase	(m_context, "render_depth_stencil",				"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboRenderCase	(m_context, "render_all",						"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		subFboGroup->addChild(new InvalidateSubFboUnbindReadCase(m_context, "unbind_read_color",				"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_COLOR_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindReadCase(m_context, "unbind_read_depth",				"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_DEPTH_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindReadCase(m_context, "unbind_read_stencil",				"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_STENCIL_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindReadCase(m_context, "unbind_read_depth_stencil",		"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindReadCase(m_context, "unbind_read_color_stencil",		"",		GL_RGBA8,		GL_DEPTH24_STENCIL8,	GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		subFboGroup->addChild(new InvalidateSubFboUnbindBlitCase(m_context, "unbind_blit_color",				"",		0,	GL_COLOR_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindBlitCase(m_context, "unbind_blit_depth",				"",		0,	GL_DEPTH_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindBlitCase(m_context, "unbind_blit_stencil",				"",		0,	GL_STENCIL_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindBlitCase(m_context, "unbind_blit_depth_stencil",		"",		0,	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

		subFboGroup->addChild(new InvalidateSubFboUnbindBlitCase(m_context, "unbind_blit_msaa_color",			"",		4,	GL_COLOR_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindBlitCase(m_context, "unbind_blit_msaa_depth",			"",		4,	GL_DEPTH_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindBlitCase(m_context, "unbind_blit_msaa_stencil",			"",		4,	GL_STENCIL_BUFFER_BIT));
		subFboGroup->addChild(new InvalidateSubFboUnbindBlitCase(m_context, "unbind_blit_msaa_depth_stencil",	"",		4,	GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
	}

	// invalidate.format.
	{
		tcu::TestCaseGroup* formatGroup = new tcu::TestCaseGroup(m_testCtx, "format", "Invalidating framebuffers with selected formats");
		addChild(formatGroup);

		// Color buffer formats.
		static const deUint32 colorFormats[] =
		{
			// RGBA formats
			GL_RGBA32I,
			GL_RGBA32UI,
			GL_RGBA16I,
			GL_RGBA16UI,
			GL_RGBA8,
			GL_RGBA8I,
			GL_RGBA8UI,
			GL_SRGB8_ALPHA8,
			GL_RGB10_A2,
			GL_RGB10_A2UI,
			GL_RGBA4,
			GL_RGB5_A1,

			// RGB formats
			GL_RGB8,
			GL_RGB565,

			// RG formats
			GL_RG32I,
			GL_RG32UI,
			GL_RG16I,
			GL_RG16UI,
			GL_RG8,
			GL_RG8I,
			GL_RG8UI,

			// R formats
			GL_R32I,
			GL_R32UI,
			GL_R16I,
			GL_R16UI,
			GL_R8,
			GL_R8I,
			GL_R8UI,

			// GL_EXT_color_buffer_float
			GL_RGBA32F,
			GL_RGBA16F,
			GL_R11F_G11F_B10F,
			GL_RG32F,
			GL_RG16F,
			GL_R32F,
			GL_R16F
		};

		// Depth/stencilbuffer formats.
		static const deUint32 depthStencilFormats[] =
		{
			GL_DEPTH_COMPONENT32F,
			GL_DEPTH_COMPONENT24,
			GL_DEPTH_COMPONENT16,
			GL_DEPTH32F_STENCIL8,
			GL_DEPTH24_STENCIL8,
			GL_STENCIL_INDEX8
		};

		// Colorbuffer tests use invalidate, unbind, read test.
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorFormats); ndx++)
			formatGroup->addChild(new InvalidateSubFboUnbindReadCase(m_context, getFormatName(colorFormats[ndx]), "", colorFormats[ndx], GL_NONE, GL_COLOR_BUFFER_BIT));

		// Depth/stencilbuffer tests use invalidate, render test.
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
			formatGroup->addChild(new InvalidateSubFboRenderCase(m_context, getFormatName(depthStencilFormats[ndx]), "", GL_RGBA8, depthStencilFormats[ndx], GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));
	}

	// invalidate.target
	{
		tcu::TestCaseGroup* targetGroup = new tcu::TestCaseGroup(m_testCtx, "target", "Invalidate target");
		addChild(targetGroup);

		static const struct
		{
			const char*		name;
			deUint32		invalidateTarget;
			deUint32		boundTarget;
		} s_targetCases[] =
		{
			{ "framebuffer_framebuffer",			GL_FRAMEBUFFER,			GL_FRAMEBUFFER		},
			{ "framebuffer_read_framebuffer",		GL_FRAMEBUFFER,			GL_READ_FRAMEBUFFER },
			{ "framebuffer_draw_framebuffer",		GL_FRAMEBUFFER,			GL_DRAW_FRAMEBUFFER },
			{ "read_framebuffer_framebuffer",		GL_READ_FRAMEBUFFER,	GL_FRAMEBUFFER		},
			{ "read_framebuffer_read_framebuffer",	GL_READ_FRAMEBUFFER,	GL_READ_FRAMEBUFFER },
			{ "read_framebuffer_draw_framebuffer",	GL_READ_FRAMEBUFFER,	GL_DRAW_FRAMEBUFFER },
			{ "draw_framebuffer_framebuffer",		GL_DRAW_FRAMEBUFFER,	GL_FRAMEBUFFER		},
			{ "draw_framebuffer_read_framebuffer",	GL_DRAW_FRAMEBUFFER,	GL_READ_FRAMEBUFFER },
			{ "draw_framebuffer_draw_framebuffer",	GL_DRAW_FRAMEBUFFER,	GL_DRAW_FRAMEBUFFER },
		};

		static const deUint32 colorAttachment[]			= { GL_COLOR_ATTACHMENT0 };
		static const deUint32 depthStencilAttachment[]	= { GL_DEPTH_STENCIL_ATTACHMENT };
		static const deUint32 allAttachments[]			= { GL_COLOR_ATTACHMENT0, GL_DEPTH_ATTACHMENT, GL_STENCIL_ATTACHMENT };

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_targetCases); caseNdx++)
		{
			const std::string	baseName		= s_targetCases[caseNdx].name;
			const deUint32		invalidateT		= s_targetCases[caseNdx].invalidateTarget;
			const deUint32		boundT			= s_targetCases[caseNdx].boundTarget;

			targetGroup->addChild(new InvalidateFboTargetCase(m_context, (baseName + "_color").c_str(),			"",	boundT, invalidateT, &colorAttachment[0],			DE_LENGTH_OF_ARRAY(colorAttachment)));
			targetGroup->addChild(new InvalidateFboTargetCase(m_context, (baseName + "_depth_stencil").c_str(),	"",	boundT, invalidateT, &depthStencilAttachment[0],	DE_LENGTH_OF_ARRAY(depthStencilAttachment)));
			targetGroup->addChild(new InvalidateFboTargetCase(m_context, (baseName + "_all").c_str(),			"",	boundT, invalidateT, &allAttachments[0],			DE_LENGTH_OF_ARRAY(allAttachments)));
		}
	}
}